

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::DrawInvalidRangeCase::iterate(DrawInvalidRangeCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  int iVar1;
  GLuint index;
  GLenum GVar2;
  undefined4 extraout_var;
  RenderTarget *pRVar3;
  deInt64 dVar4;
  GLuint end;
  GLuint start;
  CallLogWrapper gl;
  deInt64 indexLimit;
  VertexArray vao;
  Surface dst;
  Enum<int,_2UL> local_1b0;
  MessageBuilder local_1a0;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  index = glu::CallLogWrapper::glGetAttribLocation
                    (&gl,(this->m_program->m_program).m_program,"a_position");
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar3->m_width;
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  tcu::Surface::Surface(&dst,iVar1,pRVar3->m_height);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_TestCase).m_context)->m_renderCtx);
  indexLimit = 0;
  start = this->m_min;
  end = this->m_max;
  gl.m_enableLog = true;
  if ((this->m_useLimitMin != false) || (this->m_useLimitMax == true)) {
    glu::CallLogWrapper::glGetInteger64v(&gl,0x8d6b,&indexLimit);
    GVar2 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar2,"query limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                    ,0xa9);
    if ((this->m_useLimitMin & 1U) != 0) {
      if ((ulong)indexLimit >> 0x20 == 0) {
        start = (int)indexLimit - 0x10;
      }
      else {
        start = 0xfffffff0;
      }
    }
  }
  dVar4 = 0xffffffff;
  if ((ulong)indexLimit < 0xffffffff) {
    dVar4 = indexLimit;
  }
  if (this->m_useLimitMax != false) {
    end = (GLuint)dVar4;
  }
  glu::CallLogWrapper::glClearColor(&gl,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClear(&gl,0x4000);
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar2,"setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0xbe);
  glu::CallLogWrapper::glUseProgram(&gl,(this->m_program->m_program).m_program);
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar2,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0xc1);
  glu::CallLogWrapper::glBindVertexArray(&gl,vao.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindBuffer(&gl,0x8893,this->m_indexBuffer);
  glu::CallLogWrapper::glBindBuffer(&gl,0x8892,this->m_buffer);
  glu::CallLogWrapper::glEnableVertexAttribArray(&gl,index);
  glu::CallLogWrapper::glVertexAttribPointer(&gl,index,4,0x1406,'\0',0,(void *)0x0);
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar2,"set buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0xc9);
  glu::CallLogWrapper::glDrawRangeElements(&gl,0,start,end,this->m_numIndices,0x1405,(void *)0x0);
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar2 != 0) {
    local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &local_1a0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Got error: ");
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,", ignoring...");
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  glu::CallLogWrapper::glFinish(&gl);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1a0,&dst);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&local_1a0);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  tcu::Surface::~Surface(&dst);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

DrawInvalidRangeCase::IterateResult DrawInvalidRangeCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	const deInt32			positionLoc = gl.glGetAttribLocation(m_program->getProgram(), "a_position");
	tcu::Surface			dst			(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
	glu::VertexArray		vao			(m_context.getRenderContext());

	deInt64					indexLimit	= 0;
	deUint32				min			= m_min;
	deUint32				max			= m_max;

	gl.enableLogging(true);

	if (m_useLimitMin || m_useLimitMax)
	{
		gl.glGetInteger64v(GL_MAX_ELEMENT_INDEX, &indexLimit);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query limit");
	}

	if (m_useLimitMin)
	{
		if ((deUint64)indexLimit > 0xFFFFFFFFULL)
			min = 0xFFFFFFF0;
		else
			min = (deUint32)(indexLimit - 16);
	}

	if (m_useLimitMax)
	{
		if ((deUint64)indexLimit > 0xFFFFFFFFULL)
			max = 0xFFFFFFFF;
		else
			max = (deUint32)indexLimit;
	}

	gl.glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.glClear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup");

	gl.glUseProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "use program");

	gl.glBindVertexArray(*vao);
	gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);

	gl.glBindBuffer(GL_ARRAY_BUFFER, m_buffer);
	gl.glEnableVertexAttribArray(positionLoc);
	gl.glVertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set buffer");

	gl.glDrawRangeElements(GL_POINTS, min, max, m_numIndices, GL_UNSIGNED_INT, DE_NULL);

	// Indexing outside range is an error, but it doesnt need to be checked. Causes implementation-dependent behavior.
	// Even if the indices are in range (m_min = 0), the specification allows partial processing of vertices in the range,
	// which might cause access over buffer bounds. Causes implementation-dependent behavior.

	// allow errors
	{
		const deUint32 error = gl.glGetError();

		if (error != GL_NO_ERROR)
			m_testCtx.getLog() << tcu::TestLog::Message << "Got error: " << glu::getErrorStr(error) << ", ignoring..." << tcu::TestLog::EndMessage;
	}

	// read pixels to wait for rendering
	gl.glFinish();
	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}